

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter.cc
# Opt level: O3

Info * re2::Prefilter::Info::Plus(Info *a)

{
  Info *pIVar1;
  _Rb_tree_header *p_Var2;
  Prefilter *pPVar3;
  
  pIVar1 = (Info *)operator_new(0x40);
  p_Var2 = &(pIVar1->exact_)._M_t._M_impl.super__Rb_tree_header;
  (pIVar1->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pIVar1->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pIVar1->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pIVar1->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pIVar1->exact_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pIVar1->is_exact_ = false;
  pIVar1->match_ = (Prefilter *)0x0;
  if (a->is_exact_ == false) {
    pPVar3 = a->match_;
  }
  else {
    pPVar3 = OrStrings(&a->exact_);
    a->is_exact_ = false;
  }
  a->match_ = (Prefilter *)0x0;
  pIVar1->match_ = pPVar3;
  pIVar1->is_exact_ = false;
  ~Info(a);
  operator_delete(a);
  return pIVar1;
}

Assistant:

Prefilter::Info* Prefilter::Info::Plus(Info *a) {
  Info *ab = new Info();

  ab->match_ = a->TakeMatch();
  ab->is_exact_ = false;

  delete a;
  return ab;
}